

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall
string_view_operator_not_equal_Test::TestBody(string_view_operator_not_equal_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  string_view local_b8;
  string_view local_a8;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  string_view local_48;
  string_view local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  string_view_operator_not_equal_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  wabt::string_view::string_view(&local_38,"here");
  wabt::string_view::string_view(&local_48,"here");
  bVar1 = wabt::operator!=(local_38,local_48);
  local_21 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_20,
               (AssertionResult *)"string_view(\"here\") != string_view(\"here\")","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_50);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    wabt::string_view::string_view(&local_a8,"here");
    wabt::string_view::string_view(&local_b8,"there");
    local_91 = wabt::operator!=(local_a8,local_b8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_90,&local_91,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_90,
                 (AssertionResult *)"string_view(\"here\") != string_view(\"there\")","false","true"
                 ,in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                 ,0x17f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      testing::Message::~Message(&local_c0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  }
  return;
}

Assistant:

TEST(string_view, operator_not_equal) {
  ASSERT_FALSE(string_view("here") != string_view("here"));
  ASSERT_TRUE(string_view("here") != string_view("there"));
}